

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

int Fl::clipboard_contains(char *type)

{
  long lVar1;
  Window WVar2;
  Atom AVar3;
  int iVar4;
  int iVar5;
  Fl_Window *pFVar6;
  unsigned_long uVar7;
  ulong uVar8;
  uchar *portion;
  unsigned_long count;
  int format;
  unsigned_long remaining;
  Atom actual;
  XEvent event;
  
  portion = (uchar *)0x0;
  pFVar6 = first_window();
  iVar4 = 0;
  if (((pFVar6 != (Fl_Window *)0x0) && (pFVar6->i != (Fl_X *)0x0)) &&
     (WVar2 = pFVar6->i->xid, WVar2 != 0)) {
    iVar4 = 0;
    XConvertSelection(fl_display,CLIPBOARD,TARGETS,CLIPBOARD,WVar2,0);
    XFlush(fl_display);
    uVar8 = 0xffffffffffffffff;
    do {
      XNextEvent(fl_display,&event);
      if (event.type == 0x1f && event.xkey.time == 0) {
        return 0;
      }
      uVar8 = uVar8 + 1;
    } while ((uVar8 < 0x31) && (event.type != 0x1f));
    if (uVar8 < 0x31) {
      iVar4 = 0;
      XGetWindowProperty(fl_display,event.xany.window,event.xkey.time,0,4000,0,0,&actual,&format,
                         &count,&remaining,&portion);
      if (actual == 4) {
        iVar4 = strcmp(type,"text/plain");
        if (iVar4 == 0) {
          iVar4 = 0;
          uVar7 = 0;
          do {
            if (count == uVar7) goto LAB_0018f920;
            AVar3 = *(Atom *)(portion + uVar7 * 8);
          } while (((AVar3 != fl_Xatextplainutf) && (AVar3 != fl_Xatextplainutf2)) &&
                  ((AVar3 != fl_Xatextplain && (uVar7 = uVar7 + 1, AVar3 != fl_XaUtf8String))));
          iVar4 = 1;
        }
        else {
          iVar5 = strcmp(type,"image");
          iVar4 = 0;
          if (iVar5 == 0) {
            iVar4 = 0;
            uVar7 = 0;
            do {
              if (count == uVar7) goto LAB_0018f920;
              lVar1 = uVar7 * 8;
            } while ((*(Atom *)(portion + lVar1) != fl_XaImageBmp) &&
                    (uVar7 = uVar7 + 1, *(Atom *)(portion + lVar1) != fl_XaImagePNG));
            iVar4 = 1;
          }
        }
LAB_0018f920:
        XFree();
      }
    }
  }
  return iVar4;
}

Assistant:

int Fl::clipboard_contains(const char *type)
{
  XEvent event;
  Atom actual; int format; unsigned long count, remaining, i = 0;
  unsigned char* portion = NULL;
  Fl_Window *win = Fl::first_window();
  if (!win || !fl_xid(win)) return 0;
  XConvertSelection(fl_display, CLIPBOARD, TARGETS, CLIPBOARD, fl_xid(win), CurrentTime);
  XFlush(fl_display);
  do  { 
    XNextEvent(fl_display, &event); 
    if (event.type == SelectionNotify && event.xselection.property == None) return 0;
    i++; 
  }
  while (i < 50 && event.type != SelectionNotify);
  if (i >= 50) return 0;
  XGetWindowProperty(fl_display,
		     event.xselection.requestor,
		     event.xselection.property,
		     0, 4000, 0, 0,
		     &actual, &format, &count, &remaining, &portion);
  if (actual != XA_ATOM) return 0;
  Atom t;
  int retval = 0;
  if (strcmp(type, Fl::clipboard_plain_text) == 0) {
    for (i = 0; i<count; i++) { // searching for text data
      t = ((Atom*)portion)[i];
      if (t == fl_Xatextplainutf ||
	  t == fl_Xatextplainutf2 ||
	  t == fl_Xatextplain ||
	  t == fl_XaUtf8String) {
	retval = 1;
	break;
      }
    }	
  }
  else if (strcmp(type, Fl::clipboard_image) == 0) {
    for (i = 0; i<count; i++) { // searching for image data
      t = ((Atom*)portion)[i];
      if (t == fl_XaImageBmp || t == fl_XaImagePNG) {
	retval = 1;
	break;
      }
    }	
  }
  XFree(portion);
  return retval;
}